

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryObjectState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint handle,
               QueriedState *state)

{
  GLboolean v;
  bool bVar1;
  
  if (type == QUERY_ISTEXTURE) {
    v = glu::CallLogWrapper::glIsTexture(gl,handle);
    bVar1 = checkError(result,gl,"glIsTexture");
    if ((bVar1) && (bVar1 = verifyBooleanValidity(result,v), bVar1)) {
      state->m_type = DATATYPE_BOOLEAN;
      (state->m_v).vBool = v == '\x01';
    }
  }
  return;
}

Assistant:

void queryObjectState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint handle, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ISTEXTURE:
		{
			const glw::GLboolean value = gl.glIsTexture(handle);

			if (!checkError(result, gl, "glIsTexture"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}